

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateCommandSetInclusive
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,bool unique,
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          *flags,bool raii,bool raiiFactory,
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          *raiiFlags)

{
  byte bVar1;
  size_t initialSkipCount_00;
  size_t commandData_00;
  CommandData *name_00;
  bool bVar2;
  int iVar3;
  reference pFVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_218;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  *local_208;
  byte local_1e1;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  *local_1e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1d0;
  byte local_1a9;
  string local_178;
  Flags<CommandFlavourFlagBits> local_152;
  MaskType local_151;
  string local_150;
  MaskType local_129;
  string local_128;
  CommandFlavourFlagBits local_103;
  undefined1 local_102;
  CommandFlavourFlags local_101;
  bool noReturn_1;
  const_iterator cStack_100;
  Flags<CommandFlavourFlagBits> flag_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueCommands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enhancedCommands;
  string local_b0;
  CommandFlavourFlagBits local_8b;
  undefined1 local_8a;
  CommandFlavourFlags local_89;
  bool noReturn;
  const_iterator cStack_88;
  Flags<CommandFlavourFlagBits> flag;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> *__range3;
  string local_60;
  undefined1 local_3d;
  byte local_3c;
  byte local_3b;
  byte local_3a;
  byte local_39;
  bool raiiFactory_local;
  bool raii_local;
  bool unique_local;
  size_t sStack_38;
  bool definition_local;
  size_t initialSkipCount_local;
  CommandData *commandData_local;
  string *name_local;
  VulkanHppGenerator *this_local;
  string *raiiCommands;
  
  local_3a = unique;
  local_3b = raii;
  local_3c = raiiFactory;
  local_39 = definition;
  sStack_38 = initialSkipCount;
  initialSkipCount_local = (size_t)commandData;
  commandData_local = (CommandData *)name;
  name_local = &this->m_api;
  this_local = (VulkanHppGenerator *)__return_storage_ptr__;
  if ((generateCommandSetInclusive(std::__cxx11::string_const&,VulkanHppGenerator::CommandData_const&,unsigned_long,bool,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::map<unsigned_long,VulkanHppGenerator::VectorParamData,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&,bool,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&)
       ::emptyReturnParams == '\0') &&
     (iVar3 = __cxa_guard_acquire(&generateCommandSetInclusive(std::__cxx11::string_const&,VulkanHppGenerator::CommandData_const&,unsigned_long,bool,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::map<unsigned_long,VulkanHppGenerator::VectorParamData,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&,bool,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&)
                                   ::emptyReturnParams), iVar3 != 0)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&generateCommandSetInclusive::emptyReturnParams);
    __cxa_atexit(std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector,
                 &generateCommandSetInclusive::emptyReturnParams,&__dso_handle);
    __cxa_guard_release(&generateCommandSetInclusive(std::__cxx11::string_const&,VulkanHppGenerator::CommandData_const&,unsigned_long,bool,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::map<unsigned_long,VulkanHppGenerator::VectorParamData,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&,bool,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&)
                         ::emptyReturnParams);
  }
  if ((generateCommandSetInclusive(std::__cxx11::string_const&,VulkanHppGenerator::CommandData_const&,unsigned_long,bool,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::map<unsigned_long,VulkanHppGenerator::VectorParamData,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&,bool,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&)
       ::emptyVectorParams == '\0') &&
     (iVar3 = __cxa_guard_acquire(&generateCommandSetInclusive(std::__cxx11::string_const&,VulkanHppGenerator::CommandData_const&,unsigned_long,bool,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::map<unsigned_long,VulkanHppGenerator::VectorParamData,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&,bool,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&)
                                   ::emptyVectorParams), iVar3 != 0)) {
    std::
    map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::map(&generateCommandSetInclusive::emptyVectorParams);
    __cxa_atexit(std::
                 map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                 ::~map,&generateCommandSetInclusive::emptyVectorParams,&__dso_handle);
    __cxa_guard_release(&generateCommandSetInclusive(std::__cxx11::string_const&,VulkanHppGenerator::CommandData_const&,unsigned_long,bool,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::map<unsigned_long,VulkanHppGenerator::VectorParamData,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&,bool,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&)
                         ::emptyVectorParams);
  }
  if ((local_3b & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&uniqueCommands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
    __end2 = std::
             vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
             ::begin(flags);
    cStack_100 = std::
                 vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                 ::end(flags);
    while (bVar2 = __gnu_cxx::
                   operator==<const_Flags<CommandFlavourFlagBits>_*,_std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>_>
                             (&__end2,&stack0xffffffffffffff00), bVar1 = local_39,
          ((bVar2 ^ 0xffU) & 1) != 0) {
      pFVar4 = __gnu_cxx::
               __normal_iterator<const_Flags<CommandFlavourFlagBits>_*,_std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>_>
               ::operator*(&__end2);
      local_101.m_mask = pFVar4->m_mask;
      local_103 = noReturn;
      local_102 = Flags<CommandFlavourFlagBits>::operator&(&local_101,&local_103);
      local_1e1 = 1;
      if ((bool)local_102) {
        local_1e1 = local_3a ^ 0xff;
      }
      if ((local_1e1 & 1) == 0) {
        __assert_fail("!noReturn || !unique",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x11f9,
                      "std::string VulkanHppGenerator::generateCommandSetInclusive(const std::string &, const CommandData &, size_t, bool, std::vector<size_t>, std::map<size_t, VectorParamData>, bool, const std::vector<CommandFlavourFlags> &, bool, bool, const std::vector<CommandFlavourFlags> &) const"
                     );
      }
      if ((bool)local_102) {
        local_208 = &generateCommandSetInclusive::emptyVectorParams;
        local_218 = &generateCommandSetInclusive::emptyReturnParams;
      }
      else {
        local_218 = returnParams;
        local_208 = vectorParams;
      }
      local_129 = local_101.m_mask;
      generateCommandEnhanced
                (&local_128,this,(string *)commandData_local,(CommandData *)initialSkipCount_local,
                 sStack_38,(bool)(local_39 & 1),local_208,local_218,local_101);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&uniqueCommands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      name_00 = commandData_local;
      commandData_00 = initialSkipCount_local;
      initialSkipCount_00 = sStack_38;
      bVar1 = local_39;
      if ((local_3a & 1) != 0) {
        Flags<CommandFlavourFlagBits>::Flags(&local_152,unique);
        local_151 = (MaskType)Flags<CommandFlavourFlagBits>::operator|(&local_101,&local_152);
        generateCommandEnhanced
                  (&local_150,this,(string *)name_00,(CommandData *)commandData_00,
                   initialSkipCount_00,(bool)(bVar1 & 1),vectorParams,returnParams,
                   (CommandFlavourFlags)local_151);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
      }
      __gnu_cxx::
      __normal_iterator<const_Flags<CommandFlavourFlagBits>_*,_std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>_>
      ::operator++(&__end2);
    }
    generateCommandStandard
              (&local_178,this,(string *)commandData_local,(CommandData *)initialSkipCount_local,
               sStack_38,(bool)(local_39 & 1));
    generateCommandSet(__return_storage_ptr__,this,(bool)(bVar1 & 1),&local_178,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&uniqueCommands.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2);
    std::__cxx11::string::~string((string *)&local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&uniqueCommands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    local_3d = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    bVar2 = std::
            vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
            empty(raiiFlags);
    if (bVar2) {
      generateRAIIHandleCommandStandard
                (&local_60,this,(string *)commandData_local,(CommandData *)initialSkipCount_local,
                 sStack_38,(bool)(local_39 & 1));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (__return_storage_ptr__,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      __end3 = std::
               vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
               ::begin(raiiFlags);
      cStack_88 = std::
                  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  ::end(raiiFlags);
      while (bVar2 = __gnu_cxx::
                     operator==<const_Flags<CommandFlavourFlagBits>_*,_std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>_>
                               (&__end3,&stack0xffffffffffffff78), ((bVar2 ^ 0xffU) & 1) != 0) {
        pFVar4 = __gnu_cxx::
                 __normal_iterator<const_Flags<CommandFlavourFlagBits>_*,_std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>_>
                 ::operator*(&__end3);
        local_89.m_mask = pFVar4->m_mask;
        local_8b = noReturn;
        local_8a = Flags<CommandFlavourFlagBits>::operator&(&local_89,&local_8b);
        local_1a9 = 1;
        if ((bool)local_8a) {
          local_1a9 = local_3c ^ 0xff;
        }
        if ((local_1a9 & 1) == 0) {
          __assert_fail("!noReturn || !raiiFactory",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x11e6,
                        "std::string VulkanHppGenerator::generateCommandSetInclusive(const std::string &, const CommandData &, size_t, bool, std::vector<size_t>, std::map<size_t, VectorParamData>, bool, const std::vector<CommandFlavourFlags> &, bool, bool, const std::vector<CommandFlavourFlags> &) const"
                       );
        }
        if ((local_3c & 1) == 0) {
          if ((bool)local_8a) {
            local_1d0 = &generateCommandSetInclusive::emptyReturnParams;
            local_1e0 = &generateCommandSetInclusive::emptyVectorParams;
          }
          else {
            local_1e0 = vectorParams;
            local_1d0 = returnParams;
          }
          generateRAIIHandleCommandEnhanced
                    (&local_b0,this,(string *)commandData_local,
                     (CommandData *)initialSkipCount_local,sStack_38,local_1d0,local_1e0,
                     (bool)(local_39 & 1),local_89);
        }
        else {
          generateRAIIHandleCommandFactory
                    (&local_b0,this,(string *)commandData_local,
                     (CommandData *)initialSkipCount_local,sStack_38,returnParams,vectorParams,
                     (bool)(local_39 & 1),local_89);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (__return_storage_ptr__,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        __gnu_cxx::
        __normal_iterator<const_Flags<CommandFlavourFlagBits>_*,_std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>_>
        ::operator++(&__end3);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandSetInclusive( std::string const &                      name,
                                                             CommandData const &                      commandData,
                                                             size_t                                   initialSkipCount,
                                                             bool                                     definition,
                                                             std::vector<size_t>                      returnParams,
                                                             std::map<size_t, VectorParamData>        vectorParams,
                                                             bool                                     unique,
                                                             std::vector<CommandFlavourFlags> const & flags,
                                                             bool                                     raii,
                                                             bool                                     raiiFactory,
                                                             std::vector<CommandFlavourFlags> const & raiiFlags ) const
{
  static const std::vector<size_t>               emptyReturnParams;
  static const std::map<size_t, VectorParamData> emptyVectorParams;
  if ( raii )
  {
    std::string raiiCommands;
    if ( raiiFlags.empty() )
    {
      // Functions without enhancements need to have a standard implementation
      raiiCommands = generateRAIIHandleCommandStandard( name, commandData, initialSkipCount, definition );
    }
    else
    {
      for ( auto flag : raiiFlags )
      {
        const bool noReturn = flag & CommandFlavourFlagBits::noReturn;
        assert( !noReturn || !raiiFactory );  // noReturn => !raiiFactory
        raiiCommands += raiiFactory ? generateRAIIHandleCommandFactory( name, commandData, initialSkipCount, returnParams, vectorParams, definition, flag )
                                    : generateRAIIHandleCommandEnhanced( name,
                                                                         commandData,
                                                                         initialSkipCount,
                                                                         noReturn ? emptyReturnParams : returnParams,
                                                                         noReturn ? emptyVectorParams : vectorParams,
                                                                         definition,
                                                                         flag );
      }
    }
    return raiiCommands;
  }
  else
  {
    std::vector<std::string> enhancedCommands, uniqueCommands;
    for ( auto flag : flags )
    {
      const bool noReturn = flag & CommandFlavourFlagBits::noReturn;
      assert( !noReturn || !unique );  // noReturn => !unique
      enhancedCommands.push_back( generateCommandEnhanced(
        name, commandData, initialSkipCount, definition, noReturn ? emptyVectorParams : vectorParams, noReturn ? emptyReturnParams : returnParams, flag ) );
      if ( unique )
      {
        uniqueCommands.push_back(
          generateCommandEnhanced( name, commandData, initialSkipCount, definition, vectorParams, returnParams, flag | CommandFlavourFlagBits::unique ) );
      }
    }
    return generateCommandSet( definition, generateCommandStandard( name, commandData, initialSkipCount, definition ), enhancedCommands, uniqueCommands );
  }
}